

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O3

RK_U32 check_ref_pic_list(H264_SLICE_t *currSlice,RK_S32 cur_list)

{
  RK_S32 index;
  int *piVar1;
  h264_frame_store_t *phVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  RK_U32 RVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  RK_U32 RVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  h264_store_pic_t *phVar16;
  MppFrame mframe;
  MppFrame local_48;
  h264d_video_ctx_t *local_40;
  RK_S32 *local_38;
  
  piVar1 = currSlice->modification_of_pic_nums_idc[(uint)cur_list];
  local_40 = currSlice->p_Vid;
  uVar12 = local_40->max_frame_num;
  if (currSlice->structure == 3) {
    iVar13 = currSlice->frame_num;
  }
  else {
    uVar12 = uVar12 * 2;
    iVar13 = currSlice->frame_num * 2 + 1;
  }
  iVar4 = *piVar1;
  RVar11 = 0;
  if (iVar4 != 3) {
    local_38 = currSlice->abs_diff_pic_num_minus1[(uint)cur_list];
    uVar15 = 0;
    RVar11 = 0;
    iVar14 = iVar13;
    do {
      if (iVar4 < 4) {
        uVar5 = 0;
        if (iVar4 < 2) {
          if (iVar4 == 0) {
            iVar14 = iVar14 + ~local_38[uVar15];
            iVar14 = iVar14 + (iVar14 >> 0x1f & uVar12);
          }
          else {
            iVar14 = iVar14 + local_38[uVar15] + 1;
            uVar5 = uVar12;
            if (iVar14 < (int)uVar12) {
              uVar5 = 0;
            }
            iVar14 = iVar14 - uVar5;
          }
          uVar7 = 0;
          if (iVar13 < iVar14) {
            uVar7 = uVar12;
          }
          uVar8 = currSlice->p_Dpb->ref_frames_in_buffer - 1;
          uVar5 = 1;
          if (-1 < (int)uVar8) {
            lVar9 = (ulong)uVar8 + 1;
            do {
              phVar2 = currSlice->p_Dpb->fs_ref[lVar9 + -1];
              uVar8 = phVar2->is_reference;
              if (currSlice->structure == 3) {
                if (uVar8 == 3) {
                  phVar16 = phVar2->frame;
LAB_0019ae78:
                  if ((phVar16->is_long_term == '\0') && (phVar16->pic_num == iVar14 - uVar7))
                  goto LAB_0019aeac;
                }
              }
              else {
                if ((((uVar8 & 1) != 0) &&
                    (phVar16 = phVar2->top_field, phVar16->is_long_term == '\0')) &&
                   (phVar16->pic_num == iVar14 - uVar7)) {
LAB_0019aeac:
                  local_48 = (MppFrame)0x0;
                  if ((h264d_debug._1_1_ & 0x10) != 0) {
                    _mpp_log_l(4,"h264d_init","find short reference, slot_idx=%d.\n",(char *)0x0,
                               (ulong)(uint)phVar16->mem_mark->slot_idx);
                  }
                  uVar5 = 1;
                  if (((phVar16->mem_mark != (h264_dpb_mark_t *)0x0) &&
                      (index = phVar16->mem_mark->slot_idx, -1 < index)) &&
                     (mpp_buf_slot_get_prop
                                (local_40->p_Dec->frame_slots,index,SLOT_FRAME_PTR,&local_48),
                     local_48 != (MppFrame)0x0)) {
                    RVar6 = mpp_frame_get_errinfo(local_48);
                    uVar5 = (uint)(RVar6 != 0);
                  }
                  break;
                }
                if ((uVar8 & 2) != 0) {
                  phVar16 = phVar2->bottom_field;
                  goto LAB_0019ae78;
                }
              }
              lVar10 = lVar9 + -1;
              bVar3 = 0 < lVar9;
              lVar9 = lVar10;
            } while (lVar10 != 0 && bVar3);
          }
        }
        RVar11 = RVar11 | uVar5;
      }
      if (0x1f < uVar15) {
        return RVar11;
      }
      iVar4 = piVar1[uVar15 + 1];
      uVar15 = uVar15 + 1;
    } while (iVar4 != 3);
  }
  return RVar11;
}

Assistant:

static RK_U32 check_ref_pic_list(H264_SLICE_t *currSlice, RK_S32 cur_list)
{
    RK_S32 i = 0;
    RK_U32 dpb_error_flag = 0;
    RK_S32 maxPicNum = 0, currPicNum = 0;
    RK_S32 picNumLXNoWrap = 0, picNumLXPred = 0, picNumLX = 0;

    RK_S32 *modification_of_pic_nums_idc = currSlice->modification_of_pic_nums_idc[cur_list];
    RK_S32 *abs_diff_pic_num_minus1 = currSlice->abs_diff_pic_num_minus1[cur_list];
    RK_S32 *long_term_pic_idx = currSlice->long_term_pic_idx[cur_list];
    H264dVideoCtx_t *p_Vid = currSlice->p_Vid;

    if (currSlice->structure == FRAME) {
        maxPicNum  = p_Vid->max_frame_num;
        currPicNum = currSlice->frame_num;
    } else {
        maxPicNum  = 2 * p_Vid->max_frame_num;
        currPicNum = 2 * currSlice->frame_num + 1;
    }
    picNumLXPred = currPicNum;
    for (i = 0; modification_of_pic_nums_idc[i] != 3 && i < MAX_REORDER_TIMES; i++) {
        H264_StorePic_t *tmp = NULL;
        RK_U32 error_flag = 0;
        if (modification_of_pic_nums_idc[i] > 3)
            continue;
        if (modification_of_pic_nums_idc[i] < 2) {
            if (modification_of_pic_nums_idc[i] == 0) {
                if ( (picNumLXPred - (abs_diff_pic_num_minus1[i] + 1)) < 0)
                    picNumLXNoWrap = picNumLXPred - (abs_diff_pic_num_minus1[i] + 1) + maxPicNum;
                else
                    picNumLXNoWrap = picNumLXPred - (abs_diff_pic_num_minus1[i] + 1);
            } else { //!< (modification_of_pic_nums_idc[i] == 1)
                if (picNumLXPred + (abs_diff_pic_num_minus1[i] + 1) >= maxPicNum)
                    picNumLXNoWrap = picNumLXPred + (abs_diff_pic_num_minus1[i] + 1) - maxPicNum;
                else
                    picNumLXNoWrap = picNumLXPred + (abs_diff_pic_num_minus1[i] + 1);
            }
            picNumLXPred = picNumLXNoWrap;
            picNumLX = (picNumLXNoWrap > currPicNum) ? (picNumLXNoWrap - maxPicNum) : picNumLXNoWrap;
            error_flag = 1;
            if (get_short_term_pic(currSlice, picNumLX, &tmp)) { //!< find short reference
                MppFrame mframe = NULL;
                H264D_DBG(H264D_DBG_DPB_REF_ERR, "find short reference, slot_idx=%d.\n", tmp->mem_mark->slot_idx);
                if (tmp && tmp->mem_mark && tmp->mem_mark->slot_idx >= 0) {
                    mpp_buf_slot_get_prop(p_Vid->p_Dec->frame_slots, tmp->mem_mark->slot_idx, SLOT_FRAME_PTR, &mframe);
                    if (mframe && !mpp_frame_get_errinfo(mframe)) {
                        error_flag = 0;
                    }
                }
            }

        } else { //!< (modification_of_pic_nums_idc[i] == 2)
            tmp = get_long_term_pic(currSlice, long_term_pic_idx[i]);
        }
        dpb_error_flag |= error_flag;
    }

    return dpb_error_flag;
}